

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

UINT16 TPMU_SENSITIVE_COMPOSITE_Marshal
                 (TPMU_SENSITIVE_COMPOSITE *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  ushort uVar1;
  UINT16 UVar2;
  
  if ((int)selector < 0x23) {
    if (selector == 1) {
      UINT16_Marshal((UINT16 *)source,buffer,size);
      uVar1 = *(ushort *)source;
      if (uVar1 == 0) {
        UVar2 = 2;
      }
      else {
        if ((buffer != (BYTE **)0x0) &&
           ((size == (INT32 *)0x0 || (*size = *size - (uint)uVar1, -1 < *size)))) {
          memcpy(*buffer,(void *)((long)source + 2),(ulong)uVar1);
          *buffer = *buffer + uVar1;
        }
        UVar2 = uVar1 + 2;
      }
      return UVar2;
    }
    if (selector == 8) {
      UINT16_Marshal((UINT16 *)source,buffer,size);
      uVar1 = *(ushort *)source;
      if (uVar1 == 0) {
        UVar2 = 2;
      }
      else {
        if ((buffer != (BYTE **)0x0) &&
           ((size == (INT32 *)0x0 || (*size = *size - (uint)uVar1, -1 < *size)))) {
          memcpy(*buffer,(void *)((long)source + 2),(ulong)uVar1);
          *buffer = *buffer + uVar1;
        }
        UVar2 = uVar1 + 2;
      }
      return UVar2;
    }
  }
  else {
    if (selector == 0x23) {
      UINT16_Marshal((UINT16 *)source,buffer,size);
      uVar1 = *(ushort *)source;
      if (uVar1 == 0) {
        UVar2 = 2;
      }
      else {
        if ((buffer != (BYTE **)0x0) &&
           ((size == (INT32 *)0x0 || (*size = *size - (uint)uVar1, -1 < *size)))) {
          memcpy(*buffer,(void *)((long)source + 2),(ulong)uVar1);
          *buffer = *buffer + uVar1;
        }
        UVar2 = uVar1 + 2;
      }
      return UVar2;
    }
    if (selector == 0x25) {
      UINT16_Marshal((UINT16 *)source,buffer,size);
      uVar1 = *(ushort *)source;
      if (uVar1 == 0) {
        UVar2 = 2;
      }
      else {
        if ((buffer != (BYTE **)0x0) &&
           ((size == (INT32 *)0x0 || (*size = *size - (uint)uVar1, -1 < *size)))) {
          memcpy(*buffer,(void *)((long)source + 2),(ulong)uVar1);
          *buffer = *buffer + uVar1;
        }
        UVar2 = uVar1 + 2;
      }
      return UVar2;
    }
  }
  return 0;
}

Assistant:

UINT16
TPMU_SENSITIVE_COMPOSITE_Marshal(TPMU_SENSITIVE_COMPOSITE *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPM2B_PRIVATE_KEY_RSA_Marshal((TPM2B_PRIVATE_KEY_RSA *)&(source->rsa), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPM2B_ECC_PARAMETER_Marshal((TPM2B_ECC_PARAMETER *)&(source->ecc), buffer, size);
#endif // ALG_ECC
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPM2B_SENSITIVE_DATA_Marshal((TPM2B_SENSITIVE_DATA *)&(source->bits), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPM2B_SYM_KEY_Marshal((TPM2B_SYM_KEY *)&(source->sym), buffer, size);
#endif // ALG_SYMCIPHER
    }
    return 0;
}